

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O2

Direction __thiscall
spvtools::opt::LoopPeelingPass::LoopPeelingInfo::HandleInequality
          (LoopPeelingInfo *this,CmpOperator cmp_op,SExpression lhs,SERecurrentNode *rhs)

{
  long *plVar1;
  SExpression lhs_00;
  SExpression rhs_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  ulong uVar5;
  LoopPeelingInfo *this_00;
  ulong uVar6;
  SExpression SVar7;
  bool current_iteration;
  SExpression offset;
  bool first_iteration;
  pair<spvtools::opt::SExpression,_long> flip_iteration;
  SExpression coefficient;
  bool local_89;
  SExpression local_88;
  SExpression local_78;
  SExpression local_68;
  pair<spvtools::opt::SExpression,_long> local_58;
  SExpression local_40;
  
  local_88.scev_ = lhs.scev_;
  local_88.node_ = lhs.node_;
  SExpression::SExpression(&local_78,rhs->offset_);
  SExpression::SExpression(&local_40,rhs->coefficient_);
  local_68 = SExpression::operator-(&local_88,local_78.node_);
  SExpression::operator/(&local_58,&local_68,local_40);
  iVar3 = (*(local_58.first.node_)->_vptr_SENode[4])();
  if (CONCAT44(extraout_var,iVar3) != 0) {
    iVar3 = (*(local_58.first.node_)->_vptr_SENode[4])();
    plVar1 = (long *)(CONCAT44(extraout_var_00,iVar3) + 0x30);
    uVar6 = (ulong)(local_58.second != 0) + *plVar1;
    if ((uVar6 != 0 && SCARRY8((ulong)(local_58.second != 0),*plVar1) == (long)uVar6 < 0) &&
       (uVar6 < this->loop_max_iterations_)) {
      if ((cmp_op & ~kGT) == kLE && local_58.second == 0) {
        SVar7.scev_ = local_88.scev_;
        SVar7.node_ = local_88.node_;
        rhs_00.scev_ = local_78.scev_;
        rhs_00.node_ = local_78.node_;
        this_00 = this;
        bVar2 = EvalOperator(this,cmp_op,SVar7,rhs_00,(bool *)&local_68);
        if (bVar2) {
          lhs_00.scev_ = local_88.scev_;
          lhs_00.node_ = local_88.node_;
          SVar7 = GetValueAtIteration(this_00,rhs,uVar6);
          bVar2 = EvalOperator(this,cmp_op,lhs_00,SVar7,&local_89);
          if (bVar2) {
            uVar6 = uVar6 + ((bool)(char)local_68.node_ == local_89);
            goto LAB_00215613;
          }
        }
      }
      else {
LAB_00215613:
        if (uVar6 < 0xffffffff) {
          uVar5 = this->loop_max_iterations_ >> 1;
          uVar4 = (ulong)(uint)((int)this->loop_max_iterations_ - (int)uVar6);
          if (uVar6 < uVar5) {
            uVar4 = uVar6;
          }
          uVar6 = (ulong)(uVar5 <= uVar6) + 1;
          uVar4 = uVar4 << 0x20;
          goto LAB_002156ba;
        }
      }
    }
  }
  uVar6 = 0;
  uVar4 = 0;
LAB_002156ba:
  return (Direction)(uVar6 | uVar4);
}

Assistant:

LoopPeelingPass::LoopPeelingInfo::Direction
LoopPeelingPass::LoopPeelingInfo::HandleInequality(CmpOperator cmp_op,
                                                   SExpression lhs,
                                                   SERecurrentNode* rhs) const {
  SExpression offset = rhs->GetOffset();
  SExpression coefficient = rhs->GetCoefficient();
  // Compute (cst - B) / A.
  std::pair<SExpression, int64_t> flip_iteration = (lhs - offset) / coefficient;
  if (!flip_iteration.first->AsSEConstantNode()) {
    return GetNoneDirection();
  }
  // note: !!flip_iteration.second normalize to 0/1 (via bool cast).
  int64_t iteration =
      flip_iteration.first->AsSEConstantNode()->FoldToSingleValue() +
      !!flip_iteration.second;
  if (iteration <= 0 ||
      loop_max_iterations_ <= static_cast<uint64_t>(iteration)) {
    // Always true or false within the loop bounds.
    return GetNoneDirection();
  }
  // If this is a <= or >= operator and the iteration, make sure |iteration| is
  // the one flipping the condition.
  // If (cst - B) and A are not divisible, this equivalent to a < or > check, so
  // we skip this test.
  if (!flip_iteration.second &&
      (cmp_op == CmpOperator::kLE || cmp_op == CmpOperator::kGE)) {
    bool first_iteration;
    bool current_iteration;
    if (!EvalOperator(cmp_op, lhs, offset, &first_iteration) ||
        !EvalOperator(cmp_op, lhs, GetValueAtIteration(rhs, iteration),
                      &current_iteration)) {
      return GetNoneDirection();
    }
    // If the condition did not flip the next will.
    if (first_iteration == current_iteration) {
      iteration++;
    }
  }

  uint32_t cast_iteration = 0;
  // Integrity check: can we fit |iteration| in a uint32_t ?
  if (static_cast<uint64_t>(iteration) < std::numeric_limits<uint32_t>::max()) {
    cast_iteration = static_cast<uint32_t>(iteration);
  }

  if (cast_iteration) {
    // Peel before if we are closer to the start, after if closer to the end.
    if (loop_max_iterations_ / 2 > cast_iteration) {
      return Direction{LoopPeelingPass::PeelDirection::kBefore, cast_iteration};
    } else {
      return Direction{
          LoopPeelingPass::PeelDirection::kAfter,
          static_cast<uint32_t>(loop_max_iterations_ - cast_iteration)};
    }
  }

  return GetNoneDirection();
}